

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void canonicalize_slots(jit_State *J)

{
  uint uVar1;
  IRIns *pIVar2;
  TRef TVar3;
  IRIns *ir;
  TRef tr;
  BCReg s;
  jit_State *J_local;
  
  ir._4_4_ = J->baseslot + J->maxslot;
  while (ir._4_4_ = ir._4_4_ - 1, ir._4_4_ != 0) {
    uVar1 = J->slot[ir._4_4_];
    if ((((uVar1 >> 0x18 & 0x1f) - 0xf < 5) && ((uVar1 & 0x100000) == 0)) &&
       ((pIVar2 = (J->cur).ir, (&pIVar2->field_1)[uVar1 & 0xffff].o != 'G' ||
        (((&pIVar2->field_0)[uVar1 & 0xffff].op2 & 0x10) == 0)))) {
      (J->fold).ins.field_0.ot = 0x5b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
      (J->fold).ins.field_0.op2 = 0x1d3;
      TVar3 = lj_opt_fold(J);
      J->slot[ir._4_4_] = TVar3;
    }
  }
  return;
}

Assistant:

static void canonicalize_slots(jit_State *J)
{
  BCReg s;
  if (LJ_DUALNUM) return;
  for (s = J->baseslot+J->maxslot-1; s >= 1; s--) {
    TRef tr = J->slot[s];
    if (tref_isinteger(tr) && !(tr & TREF_KEYINDEX)) {
      IRIns *ir = IR(tref_ref(tr));
      if (!(ir->o == IR_SLOAD && (ir->op2 & (IRSLOAD_READONLY))))
	J->slot[s] = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
    }
  }
}